

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O3

void opj_mqc_flush(opj_mqc_t *mqc)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = mqc->c | 0xffff;
  uVar2 = uVar1 - 0x8000;
  if (uVar1 < mqc->a + mqc->c) {
    uVar2 = uVar1;
  }
  mqc->c = uVar2 << ((byte)mqc->ct & 0x1f);
  opj_mqc_byteout(mqc);
  mqc->c = mqc->c << ((byte)mqc->ct & 0x1f);
  opj_mqc_byteout(mqc);
  if (*mqc->bp != 0xff) {
    mqc->bp = mqc->bp + 1;
  }
  return;
}

Assistant:

void opj_mqc_flush(opj_mqc_t *mqc)
{
    /* C.2.9 Termination of coding (FLUSH) */
    /* Figure C.11 – FLUSH procedure */
    opj_mqc_setbits(mqc);
    mqc->c <<= mqc->ct;
    opj_mqc_byteout(mqc);
    mqc->c <<= mqc->ct;
    opj_mqc_byteout(mqc);

    /* It is forbidden that a coding pass ends with 0xff */
    if (*mqc->bp != 0xff) {
        /* Advance pointer so that opj_mqc_numbytes() returns a valid value */
        mqc->bp++;
    }
}